

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::set_end
          (segment_index_iterator<std::_List_iterator<char>_> *this)

{
  mapping_type *pmVar1;
  element_type *peVar2;
  _List_node_base *p_Var3;
  unsigned_long uVar4;
  
  pmVar1 = this->map_;
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar4 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  (this->current_).first = uVar4 - 1;
  (this->current_).second = uVar4;
  p_Var3 = (pmVar1->end_)._M_node;
  (this->value_).super_pair<std::_List_iterator<char>,_std::_List_iterator<char>_>.first._M_node =
       p_Var3;
  (this->value_).super_pair<std::_List_iterator<char>,_std::_List_iterator<char>_>.second._M_node =
       p_Var3;
  (this->value_).rule_ = 0;
  return;
}

Assistant:

index_type const &index() const
                    {
                        return map_->index();
                    }